

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Start_Resume_PDU::Start_Resume_PDU
          (Start_Resume_PDU *this,Simulation_Management_Header *SimMgrHeader,
          ClockTime *RealWorldTime,ClockTime *SimTime,KUINT32 ReqID)

{
  KUINT32 ReqID_local;
  ClockTime *SimTime_local;
  ClockTime *RealWorldTime_local;
  Simulation_Management_Header *SimMgrHeader_local;
  Start_Resume_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,SimMgrHeader);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Start_Resume_PDU_003307b8;
  DATA_TYPE::ClockTime::ClockTime(&this->m_RealWorldTime,RealWorldTime);
  DATA_TYPE::ClockTime::ClockTime(&this->m_SimTime,SimTime);
  this->m_ui32RequestID = ReqID;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\r';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x2c;
  return;
}

Assistant:

Start_Resume_PDU::Start_Resume_PDU( const Simulation_Management_Header & SimMgrHeader, const ClockTime & RealWorldTime,
                                    const ClockTime & SimTime, KUINT32 ReqID  ) :
    Simulation_Management_Header( SimMgrHeader ),
    m_RealWorldTime( RealWorldTime ),
    m_SimTime( SimTime ),
    m_ui32RequestID( ReqID )
{
    m_ui8PDUType = Start_Resume_PDU_Type;
    m_ui16PDULength = START_RESUME_PDU_SIZE;
}